

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  ostream *poVar3;
  invalid_argument *piVar4;
  size_type sVar5;
  reference ppcVar6;
  ostream *poVar7;
  long in_RSI;
  int in_EDI;
  exception *e;
  size_t i_1;
  char *libraryVersion;
  int mode;
  int i;
  bool override;
  char *outFile;
  char *view;
  vector<const_char_*,_std::allocator<const_char_*>_> views;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  bool in_stack_000001f7;
  char *in_stack_000001f8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_00000200;
  undefined1 in_stack_000002cf;
  char *in_stack_000002d0;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_000002d8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_000002e0;
  undefined1 in_stack_0000043f;
  char *in_stack_00000440;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_00000448;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_00000450;
  char *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  ostream *in_stack_fffffffffffffe50;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffe90;
  ulong local_80;
  int local_5c;
  int local_58;
  bool local_51;
  char *local_50;
  vector<const_char_*,_std::allocator<const_char_*>_> local_40;
  vector<const_char_*,_std::allocator<const_char_*>_> local_28;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x10c3be);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x10c3cb);
  local_50 = (char *)0x0;
  local_51 = false;
  local_58 = 1;
  local_5c = 0;
  do {
    if (local_8 <= local_58) {
      sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_28);
      if (sVar5 == 0) {
        usageMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,false);
        local_4 = 1;
        bVar1 = true;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"input:");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        for (local_80 = 0;
            sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_28),
            local_80 < sVar5; local_80 = local_80 + 1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"      ");
          ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&local_28,local_80);
          std::operator<<(poVar3,*ppcVar6);
          ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (&local_40,local_80);
          if (*ppcVar6 != (value_type)0x0) {
            poVar3 = std::operator<<((ostream *)&std::cout," in view ");
            ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (&local_40,local_80);
            std::operator<<(poVar3,*ppcVar6);
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        if (local_50 == (char *)0x0) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar4,"No output file specified");
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"output:\n      ");
        poVar7 = std::operator<<(poVar3,local_50);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cout,"override:");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_51);
        poVar7 = std::operator<<(poVar7,"\n");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        iVar2 = strcmp(*(char **)(local_10 + 8),"-combine");
        if (iVar2 == 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"-combine multipart input ");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    (in_stack_fffffffffffffe90,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)poVar3);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    (in_stack_fffffffffffffe90,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)poVar3);
          combine(in_stack_00000450,in_stack_00000448,in_stack_00000440,(bool)in_stack_0000043f);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     in_stack_fffffffffffffe50);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     in_stack_fffffffffffffe50);
        }
        else {
          iVar2 = strcmp(*(char **)(local_10 + 8),"-separate");
          if (iVar2 == 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,"-separate multipart input ");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                      (in_stack_fffffffffffffe90,
                       (vector<const_char_*,_std::allocator<const_char_*>_> *)poVar3);
            separate(in_stack_00000200,in_stack_000001f8,in_stack_000001f7);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       in_stack_fffffffffffffe50);
          }
          else {
            iVar2 = strcmp(*(char **)(local_10 + 8),"-convert");
            if (iVar2 == 0) {
              in_stack_fffffffffffffe50 =
                   std::operator<<((ostream *)&std::cout,"-convert input to EXR2 multipart");
              std::ostream::operator<<
                        (in_stack_fffffffffffffe50,std::endl<char,std::char_traits<char>>);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                        (in_stack_fffffffffffffe90,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)poVar3);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                        (in_stack_fffffffffffffe90,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)poVar3);
              convert(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,(bool)in_stack_000002cf)
              ;
              std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffe50);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffe50);
            }
            else {
              usageMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,false);
            }
          }
        }
        bVar1 = false;
      }
LAB_0010ce20:
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe50);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffe50);
      if (!bVar1) {
        local_4 = 0;
      }
      return local_4;
    }
    iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"-h");
    if ((iVar2 == 0) ||
       (iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"--help"), iVar2 == 0)) {
      usageMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,false);
      local_4 = 0;
      bVar1 = true;
      goto LAB_0010ce20;
    }
    iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"--version");
    if (iVar2 == 0) {
      __s1 = (char *)Imf_3_2::getLibraryVersion();
      poVar3 = std::operator<<((ostream *)&std::cout,"exrmultipart (OpenEXR) ");
      std::operator<<(poVar3,"3.2.0");
      iVar2 = strcmp(__s1,"3.2.0");
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
        poVar3 = std::operator<<(poVar3,__s1);
        std::operator<<(poVar3,")");
      }
      poVar3 = std::operator<<((ostream *)&std::cout," https://openexr.com");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Copyright (c) Contributors to the OpenEXR Project");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      bVar1 = true;
      goto LAB_0010ce20;
    }
    iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"-i");
    if (iVar2 == 0) {
      local_5c = 1;
    }
    else {
      iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"-o");
      if (iVar2 == 0) {
        local_5c = 2;
      }
      else {
        iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"-override");
        if (iVar2 == 0) {
          local_5c = 3;
        }
        else {
          iVar2 = strcmp(*(char **)(local_10 + (long)local_58 * 8),"-view");
          if (iVar2 == 0) {
            if (local_5c != 1) {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar4,"-view requires -i");
              __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            local_5c = 4;
          }
          else {
            switch(local_5c) {
            case 1:
              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
              break;
            case 2:
              local_50 = *(char **)(local_10 + (long)local_58 * 8);
              break;
            case 3:
              iVar2 = atoi(*(char **)(local_10 + (long)local_58 * 8));
              local_51 = iVar2 != 0;
              break;
            case 4:
              local_5c = 1;
            }
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

int
main (int argc, char* argv[])
{
    try {
        
        vector<const char*> inFiles;
        vector<const char*> views;
        const char*         view     = 0;
        const char*         outFile  = 0;
        bool                override = false;

        int i = 1;
        int mode = 0; // 0-do not read input, 1-infiles, 2-outfile, 3-override, 4-view

        while (i < argc)
        {
            if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))     
            {
                usageMessage (cout, "exrmultipart", true);
                return 0;
            }

            if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrmultipart (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }

            if (!strcmp (argv[i], "-i"))
            {
                mode = 1;
            }
            else if (!strcmp (argv[i], "-o"))
            {
                mode = 2;
            }
            else if (!strcmp (argv[i], "-override"))
            {
                mode = 3;
            }
            else if (!strcmp (argv[i], "-view"))
            {
                if (mode != 1)
                    throw invalid_argument("-view requires -i");

                mode = 4;
            }
            else
            {
                switch (mode)
                {
                  case 1:
                      inFiles.push_back (argv[i]);
                      views.push_back (view);
                      break;
                  case 2: outFile = argv[i]; break;
                  case 3: override = atoi (argv[i]); break;
                  case 4:
                      view = argv[i];
                      mode = 1;
                      break;
                }
            }
            i++;
        }

        // check input and output files found or not
        if (inFiles.size () == 0)
        {
            usageMessage(cerr, argv[0], false);
            return 1;
        }

        cout << "input:" << endl;
        for (size_t i = 0; i < inFiles.size (); i++)
        {
            cout << "      " << inFiles[i];
            if (views[i])
                cout << " in view " << views[i];
            cout << endl;
        }

        if (!outFile)
            throw invalid_argument("No output file specified");

        cout << "output:\n      " << outFile << endl;
        cout << "override:" << override << "\n" << endl;

        if (!strcmp (argv[1], "-combine"))
        {
            cout << "-combine multipart input " << endl;
            combine (inFiles, views, outFile, override);
        }
        else if (!strcmp (argv[1], "-separate"))
        {
            cout << "-separate multipart input " << endl;
            separate (inFiles, outFile, override);
        }
        else if (!strcmp (argv[1], "-convert"))
        {
            cout << "-convert input to EXR2 multipart" << endl;
            convert (inFiles, views, outFile, override);
        }
        else
        {
            usageMessage (cerr, argv[0], false);
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }
    
    return 0;
}